

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cpp
# Opt level: O2

void __thiscall sznet::CountDownLatch::countDown(CountDownLatch *this)

{
  int *piVar1;
  MutexLockGuard local_18;
  MutexLockGuard lock;
  
  local_18.m_mutex = &this->m_mutex;
  MutexLock::lock(local_18.m_mutex);
  piVar1 = &this->m_count;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    sz_cond_notifyall(&(this->m_condition).m_cond);
  }
  MutexLockGuard::~MutexLockGuard(&local_18);
  return;
}

Assistant:

void CountDownLatch::countDown()
{
	MutexLockGuard lock(m_mutex);
	--m_count;
	if (m_count == 0)
	{
		m_condition.notifyAll();
	}
}